

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_binning_array_unaligned.h
# Opt level: O2

Split * __thiscall
embree::sse2::UnalignedHeuristicArrayBinningSAH<embree::PrimRef,_32UL>::find_template<true>
          (Split *__return_storage_ptr__,
          UnalignedHeuristicArrayBinningSAH<embree::PrimRef,_32UL> *this,PrimInfoRange *set,
          size_t logBlockSize,LinearSpace3fa *space)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  char cVar3;
  long lVar4;
  ulong uVar5;
  runtime_error *this_00;
  undefined8 *puVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  undefined1 (*pauVar11) [16];
  float fVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  ulong uVar21;
  float fVar22;
  uint uVar23;
  uint uVar25;
  uint uVar26;
  undefined1 auVar24 [16];
  uint uVar27;
  uint uVar28;
  uint uVar30;
  uint uVar31;
  undefined1 auVar29 [16];
  uint uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar37;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar38;
  float fVar39;
  float fVar41;
  float fVar42;
  undefined1 auVar40 [16];
  undefined1 auVar43 [16];
  uint uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  float fVar48;
  float fVar49;
  BinMapping<32UL> mapping;
  BinBoundsAndCenter binBoundsAndCenter;
  task_group_context context;
  Binner binner;
  vfloat4 rAreas [32];
  anon_class_24_3_4f408fa6 local_1f50;
  undefined1 local_1f30 [8];
  undefined8 uStack_1f28;
  size_type local_1f20;
  anon_class_8_1_b5464bae local_1f10;
  PrimRef *local_1f08;
  undefined1 local_1f00 [20];
  float fStack_1eec;
  float fStack_1ee8;
  float fStack_1ee4;
  float local_1ee0;
  uint uStack_1edc;
  uint uStack_1ed8;
  uint uStack_1ed4;
  anon_class_16_2_ed117de8_conflict14 local_1ed0;
  BinBoundsAndCenter local_1ec0;
  task_group_context local_1e80 [3];
  undefined8 auStack_1cd0 [2];
  undefined8 auStack_1cc0 [2];
  undefined8 auStack_1cb0 [2];
  undefined8 auStack_1ca0 [2];
  undefined8 auStack_1c90 [2];
  undefined1 local_1c80 [3580];
  undefined4 uStack_e84;
  undefined1 local_e80 [20];
  float afStack_e6c [911];
  
  puVar6 = (undefined8 *)(local_1c80 + 0xc00);
  for (lVar4 = 0x50; lVar4 != 0xc50; lVar4 = lVar4 + 0x60) {
    *(undefined8 *)((long)auStack_1c90 + lVar4) = 0x7f8000007f800000;
    *(undefined8 *)((long)auStack_1c90 + lVar4 + 8) = 0x7f8000007f800000;
    *(undefined8 *)(local_1c80 + lVar4) = 0xff800000ff800000;
    *(undefined8 *)(local_1c80 + lVar4 + 8) = 0xff800000ff800000;
    *(undefined8 *)((long)auStack_1cb0 + lVar4) = 0x7f8000007f800000;
    *(undefined8 *)((long)auStack_1cb0 + lVar4 + 8) = 0x7f8000007f800000;
    *(undefined8 *)((long)auStack_1ca0 + lVar4) = 0xff800000ff800000;
    *(undefined8 *)((long)auStack_1ca0 + lVar4 + 8) = 0xff800000ff800000;
    *(undefined8 *)((long)auStack_1cd0 + lVar4) = 0x7f8000007f800000;
    *(undefined8 *)((long)auStack_1cd0 + lVar4 + 8) = 0x7f8000007f800000;
    *(undefined8 *)((long)auStack_1cc0 + lVar4) = 0xff800000ff800000;
    *(undefined8 *)((long)auStack_1cc0 + lVar4 + 8) = 0xff800000ff800000;
    *puVar6 = 0;
    puVar6[1] = 0;
    puVar6 = puVar6 + 2;
  }
  uVar1 = (set->super_range<unsigned_long>)._begin;
  uVar2 = (set->super_range<unsigned_long>)._end;
  fVar12 = (float)(uVar2 - uVar1) * 0.05 + 4.0;
  uVar5 = (ulong)fVar12;
  uVar5 = (long)(fVar12 - 9.223372e+18) & (long)uVar5 >> 0x3f | uVar5;
  local_1f00._0_8_ = 0x20;
  if (uVar5 < 0x20) {
    local_1f00._0_8_ = uVar5;
  }
  local_1f50.mapping = (BinMapping<32UL> *)local_1f00;
  local_1f00._16_4_ = (set->super_CentGeomBBox3fa).centBounds.lower.field_0.m128[0];
  fStack_1eec = (set->super_CentGeomBBox3fa).centBounds.lower.field_0.m128[1];
  fStack_1ee8 = (set->super_CentGeomBBox3fa).centBounds.lower.field_0.m128[2];
  fStack_1ee4 = (set->super_CentGeomBBox3fa).centBounds.lower.field_0.m128[3];
  auVar29._0_4_ =
       (set->super_CentGeomBBox3fa).centBounds.upper.field_0.m128[0] - (float)local_1f00._16_4_;
  auVar29._4_4_ = (set->super_CentGeomBBox3fa).centBounds.upper.field_0.m128[1] - fStack_1eec;
  auVar29._8_4_ = (set->super_CentGeomBBox3fa).centBounds.upper.field_0.m128[2] - fStack_1ee8;
  auVar29._12_4_ = (set->super_CentGeomBBox3fa).centBounds.upper.field_0.m128[3] - fStack_1ee4;
  auVar33 = maxps(_DAT_01f46b30,auVar29);
  auVar24._0_4_ = (float)(long)local_1f00._0_8_ * 0.99;
  auVar24._4_4_ = auVar24._0_4_;
  auVar24._8_4_ = auVar24._0_4_;
  auVar24._12_4_ = auVar24._0_4_;
  auVar29 = divps(auVar24,auVar33);
  local_1ee0 = (float)(-(uint)((float)DAT_01f46b30 < auVar33._0_4_) & auVar29._0_4_);
  uStack_1edc = -(uint)(DAT_01f46b30._4_4_ < auVar33._4_4_) & auVar29._4_4_;
  uStack_1ed8 = -(uint)(DAT_01f46b30._8_4_ < auVar33._8_4_) & auVar29._8_4_;
  uStack_1ed4 = -(uint)(DAT_01f46b30._12_4_ < auVar33._12_4_) & auVar29._12_4_;
  local_1ec0.scene = this->scene;
  local_1f50.binBoundsAndCenter = &local_1ec0;
  local_1ec0.space.vx.field_0._0_8_ = *(undefined8 *)&(space->vx).field_0;
  local_1ec0.space.vx.field_0._8_8_ = *(undefined8 *)((long)&(space->vx).field_0 + 8);
  local_1ec0.space.vy.field_0._0_8_ = *(undefined8 *)&(space->vy).field_0;
  local_1ec0.space.vy.field_0._8_8_ = *(undefined8 *)((long)&(space->vy).field_0 + 8);
  local_1ec0.space.vz.field_0._0_8_ = *(undefined8 *)&(space->vz).field_0;
  local_1ec0.space.vz.field_0._8_8_ = *(undefined8 *)((long)&(space->vz).field_0 + 8);
  local_1f08 = this->prims;
  local_1f50.prims = &local_1f08;
  local_1f10.mapping = local_1f50.mapping;
  tbb::detail::d1::task_group_context::task_group_context(local_1e80,(context_traits)0x4,CUSTOM_CTX)
  ;
  local_1f20 = 0x1000;
  local_1f30 = (undefined1  [8])uVar2;
  uStack_1f28 = uVar1;
  local_1ed0.reduction = &local_1f10;
  local_1ed0.func = &local_1f50;
  tbb::detail::d1::
  parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,_embree::sse2::BinInfoT<32UL,_embree::PrimRef,_embree::BBox<embree::Vec3fa>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders____builders_______common_algorithms_parallel_reduce_h:59:7),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders____builders_heuristic_binning_h:549:31)>
            ((BinInfoT<32UL,_embree::PrimRef,_embree::BBox<embree::Vec3fa>_> *)local_e80,
             (blocked_range<unsigned_long> *)local_1f30,
             (BinInfoT<32UL,_embree::PrimRef,_embree::BBox<embree::Vec3fa>_> *)local_1c80,
             &local_1ed0,&local_1f10,local_1e80);
  cVar3 = tbb::detail::r1::is_group_execution_cancelled(local_1e80);
  if (cVar3 == '\0') {
    tbb::detail::d1::task_group_context::~task_group_context(local_1e80);
    BinInfoT<32UL,_embree::PrimRef,_embree::BBox<embree::Vec3fa>_>::operator=
              ((BinInfoT<32UL,_embree::PrimRef,_embree::BBox<embree::Vec3fa>_> *)local_1c80,
               (BinInfoT<32UL,_embree::PrimRef,_embree::BBox<embree::Vec3fa>_> *)local_e80);
    lVar7 = local_1f00._0_8_ * 0x60 + -0x10;
    lVar4 = local_1f00._0_8_ * 0x10 + 0xbf0;
    iVar13 = 0;
    iVar15 = 0;
    iVar17 = 0;
    iVar19 = 0;
    auVar29 = _DAT_01f45a30;
    auVar24 = _DAT_01f45a40;
    auVar33 = _DAT_01f45a30;
    auVar34 = _DAT_01f45a40;
    auVar40 = _DAT_01f45a30;
    auVar43 = _DAT_01f45a40;
    lVar9 = local_1f00._0_8_ * 0x10;
    for (uVar5 = 1; local_1f00._0_8_ != uVar5; uVar5 = uVar5 + 1) {
      iVar13 = iVar13 + *(int *)(local_1c80 + lVar4);
      iVar15 = iVar15 + *(int *)(local_1c80 + lVar4 + 4);
      iVar17 = iVar17 + *(int *)(local_1c80 + lVar4 + 8);
      iVar19 = iVar19 + *(int *)(local_1c80 + lVar4 + 0xc);
      auVar33 = minps(auVar33,*(undefined1 (*) [16])((long)auStack_1cd0 + lVar7));
      auVar34 = maxps(auVar34,*(undefined1 (*) [16])((long)auStack_1cc0 + lVar7));
      *(int *)(local_1e80[0].padding + lVar9 + -0x58) = iVar13;
      *(int *)(local_1e80[0].padding + lVar9 + -0x54) = iVar15;
      *(int *)(local_1e80[0].padding + lVar9 + -0x50) = iVar17;
      *(int *)(local_1e80[0].padding + lVar9 + -0x4c) = iVar19;
      auVar29 = minps(auVar29,*(undefined1 (*) [16])((long)auStack_1cb0 + lVar7));
      fVar12 = auVar34._4_4_ - auVar33._4_4_;
      fVar37 = auVar34._8_4_ - auVar33._8_4_;
      auVar24 = maxps(auVar24,*(undefined1 (*) [16])((long)auStack_1ca0 + lVar7));
      fVar38 = auVar24._4_4_ - auVar29._4_4_;
      fVar39 = auVar24._8_4_ - auVar29._8_4_;
      auVar40 = minps(auVar40,*(undefined1 (*) [16])((long)auStack_1c90 + lVar7));
      auVar43 = maxps(auVar43,*(undefined1 (*) [16])(local_1c80 + lVar7));
      *(ulong *)(local_1c80 + lVar9 + 0xdf0) =
           CONCAT44((auVar24._0_4_ - auVar29._0_4_) * (fVar38 + fVar39) + fVar39 * fVar38,
                    (auVar34._0_4_ - auVar33._0_4_) * (fVar12 + fVar37) + fVar37 * fVar12);
      fVar12 = auVar43._4_4_ - auVar40._4_4_;
      fVar37 = auVar43._8_4_ - auVar40._8_4_;
      *(float *)(local_1c80 + lVar9 + 0xdf8) =
           (fVar12 + fVar37) * (auVar43._0_4_ - auVar40._0_4_) + fVar37 * fVar12;
      *(undefined4 *)((long)&uStack_e84 + lVar9) = 0;
      lVar7 = lVar7 + -0x60;
      lVar4 = lVar4 + -0x10;
      lVar9 = lVar9 + -0x10;
    }
    uVar5 = 0xffffffffffffffff;
    uVar10 = ~(-1 << ((byte)logBlockSize & 0x1f));
    uVar28 = 1;
    uVar30 = 1;
    uVar31 = 1;
    uVar32 = 1;
    local_1f30._0_4_ = (undefined4)DAT_01f45a30;
    local_1f30._4_4_ = DAT_01f45a30._4_4_;
    fVar12 = DAT_01f45a30._8_4_;
    fVar37 = DAT_01f45a30._12_4_;
    uVar23 = 0;
    uVar25 = 0;
    uVar26 = 0;
    uVar27 = 0;
    pauVar11 = (undefined1 (*) [16])(local_1c80 + 0x50);
    lVar4 = 0;
    iVar13 = 0;
    iVar15 = 0;
    iVar17 = 0;
    iVar19 = 0;
    auVar29 = _DAT_01f45a40;
    auVar24 = _DAT_01f45a40;
    auVar33 = _DAT_01f45a30;
    auVar34 = _DAT_01f45a30;
    auVar40 = _DAT_01f45a30;
    auVar43 = _DAT_01f45a40;
    for (uVar8 = 1; uVar8 < (ulong)local_1f00._0_8_; uVar8 = uVar8 + 1) {
      auVar40 = minps(auVar40,pauVar11[-5]);
      auVar43 = maxps(auVar43,pauVar11[-4]);
      auVar34 = minps(auVar34,pauVar11[-3]);
      auVar24 = maxps(auVar24,pauVar11[-2]);
      fVar48 = auVar43._4_4_ - auVar40._4_4_;
      fVar49 = auVar43._8_4_ - auVar40._8_4_;
      auVar33 = minps(auVar33,pauVar11[-1]);
      fVar41 = auVar24._4_4_ - auVar34._4_4_;
      fVar42 = auVar24._8_4_ - auVar34._8_4_;
      auVar29 = maxps(auVar29,*pauVar11);
      fVar38 = auVar29._0_4_ - auVar33._0_4_;
      fVar39 = auVar29._4_4_ - auVar33._4_4_;
      fVar22 = auVar29._8_4_ - auVar33._8_4_;
      iVar13 = iVar13 + *(int *)(local_1c80 + lVar4 + 0xc00);
      iVar15 = iVar15 + *(int *)(local_1c80 + lVar4 + 0xc04);
      iVar17 = iVar17 + *(int *)(local_1c80 + lVar4 + 0xc08);
      iVar19 = iVar19 + *(int *)(local_1c80 + lVar4 + 0xc0c);
      uVar21 = logBlockSize & 0xffffffff;
      uVar14 = iVar13 + uVar10 >> uVar21;
      uVar16 = iVar15 + uVar10 >> uVar21;
      uVar18 = iVar17 + uVar10 >> uVar21;
      uVar20 = iVar19 + uVar10 >> uVar21;
      uVar44 = *(int *)(local_1e80[0].padding + lVar4 + -0x38) + uVar10 >> uVar21;
      uVar45 = *(int *)(local_1e80[0].padding + lVar4 + -0x34) + uVar10 >> uVar21;
      uVar46 = *(int *)(local_1e80[0].padding + lVar4 + -0x30) + uVar10 >> uVar21;
      uVar47 = *(int *)(local_1e80[0].padding + lVar4 + -0x2c) + uVar10 >> uVar21;
      auVar35._0_4_ =
           ((float)(uVar44 & 0x7fffffff) + (float)((int)uVar44 >> 0x1f & 0x4f000000)) *
           *(float *)(local_e80 + lVar4 + 0x10) +
           ((float)(uVar14 & 0x7fffffff) + (float)((int)uVar14 >> 0x1f & 0x4f000000)) *
           ((auVar43._0_4_ - auVar40._0_4_) * (fVar48 + fVar49) + fVar49 * fVar48);
      auVar35._4_4_ =
           ((float)(uVar45 & 0x7fffffff) + (float)((int)uVar45 >> 0x1f & 0x4f000000)) *
           *(float *)((long)afStack_e6c + lVar4) +
           ((float)(uVar16 & 0x7fffffff) + (float)((int)uVar16 >> 0x1f & 0x4f000000)) *
           ((auVar24._0_4_ - auVar34._0_4_) * (fVar41 + fVar42) + fVar42 * fVar41);
      auVar35._8_4_ =
           ((float)(uVar46 & 0x7fffffff) + (float)((int)uVar46 >> 0x1f & 0x4f000000)) *
           *(float *)((long)afStack_e6c + lVar4 + 4) +
           ((float)(uVar18 & 0x7fffffff) + (float)((int)uVar18 >> 0x1f & 0x4f000000)) *
           (fVar38 * (fVar22 + fVar39) + fVar39 * fVar22);
      auVar35._12_4_ =
           ((float)(uVar47 & 0x7fffffff) + (float)((int)uVar47 >> 0x1f & 0x4f000000)) *
           *(float *)((long)afStack_e6c + lVar4 + 8) +
           ((float)(uVar20 & 0x7fffffff) + (float)((int)uVar20 >> 0x1f & 0x4f000000)) *
           (fVar38 * (fVar39 + fVar22) + fVar22 * fVar39);
      uVar23 = uVar23 & -(uint)((float)local_1f30._0_4_ <= auVar35._0_4_) |
               ~-(uint)((float)local_1f30._0_4_ <= auVar35._0_4_) & uVar28;
      uVar25 = uVar25 & -(uint)((float)local_1f30._4_4_ <= auVar35._4_4_) |
               ~-(uint)((float)local_1f30._4_4_ <= auVar35._4_4_) & uVar30;
      uVar26 = uVar26 & -(uint)(fVar12 <= auVar35._8_4_) |
               ~-(uint)(fVar12 <= auVar35._8_4_) & uVar31;
      uVar27 = uVar27 & -(uint)(fVar37 <= auVar35._12_4_) |
               ~-(uint)(fVar37 <= auVar35._12_4_) & uVar32;
      auVar36._4_4_ = local_1f30._4_4_;
      auVar36._0_4_ = local_1f30._0_4_;
      auVar36._8_4_ = fVar12;
      auVar36._12_4_ = fVar37;
      auVar36 = minps(auVar35,auVar36);
      uVar28 = uVar28 + 1;
      uVar30 = uVar30 + 1;
      uVar31 = uVar31 + 1;
      uVar32 = uVar32 + 1;
      lVar4 = lVar4 + 0x10;
      pauVar11 = pauVar11 + 6;
      local_1f30._0_4_ = auVar36._0_4_;
      local_1f30._4_4_ = auVar36._4_4_;
      fVar12 = auVar36._8_4_;
      fVar37 = auVar36._12_4_;
    }
    uStack_1f28 = CONCAT44(fVar37,fVar12);
    local_1f50.prims = (PrimRef **)CONCAT44(uVar25,uVar23);
    local_1f50.mapping = (BinMapping<32UL> *)CONCAT44(uVar27,uVar26);
    fVar12 = INFINITY;
    iVar13 = 0;
    for (uVar8 = 0; uVar8 != 3; uVar8 = uVar8 + 1) {
      if (((((&local_1ee0)[uVar8] != 0.0) || (NAN((&local_1ee0)[uVar8]))) &&
          (*(float *)(local_1f30 + uVar8 * 4) < fVar12)) &&
         (iVar15 = *(int *)((long)&local_1f50.prims + uVar8 * 4), iVar15 != 0)) {
        uVar5 = uVar8 & 0xffffffff;
        iVar13 = iVar15;
        fVar12 = *(float *)(local_1f30 + uVar8 * 4);
      }
    }
    __return_storage_ptr__->sah = fVar12;
    __return_storage_ptr__->dim = (int)uVar5;
    (__return_storage_ptr__->field_2).pos = iVar13;
    __return_storage_ptr__->data = 0;
    (__return_storage_ptr__->mapping).num = local_1f00._0_8_;
    *(ulong *)&(__return_storage_ptr__->mapping).ofs.field_0 =
         CONCAT44(fStack_1eec,local_1f00._16_4_);
    *(ulong *)((long)&(__return_storage_ptr__->mapping).ofs.field_0 + 8) =
         CONCAT44(fStack_1ee4,fStack_1ee8);
    *(ulong *)&(__return_storage_ptr__->mapping).scale.field_0 = CONCAT44(uStack_1edc,local_1ee0);
    *(ulong *)((long)&(__return_storage_ptr__->mapping).scale.field_0 + 8) =
         CONCAT44(uStack_1ed4,uStack_1ed8);
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"task cancelled");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const Split find_template(const PrimInfoRange& set, const size_t logBlockSize, const LinearSpace3fa& space)
        {
          Binner binner(empty);
          const BinMapping<BINS> mapping(set);
          BinBoundsAndCenter binBoundsAndCenter(scene,space);
          bin_serial_or_parallel<parallel>(binner,prims,set.begin(),set.end(),size_t(4096),mapping,binBoundsAndCenter);
          return binner.best(mapping,logBlockSize);
        }